

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

int utf8_decode(char *src,int *size)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  bVar1 = *src;
  uVar4 = (uint)bVar1;
  *size = 1;
  if ((char)bVar1 < '\0') {
    bVar2 = src[1];
    uVar3 = (uint)bVar1;
    if ((uVar4 & 0xffffffe0) == 0xc0) {
      uVar4 = (uVar4 & 0x1f) << 6 | (uint)bVar2;
      iVar5 = 2;
      if (uVar4 < 0x80) {
        return -1;
      }
    }
    else if ((uVar3 & 0xfffffff0) == 0xe0) {
      uVar4 = (uint)bVar2 << 6 | (uVar4 & 0xf) << 0xc;
      if (0xfffff7ff < uVar4 - 0xe000 || uVar4 < 0x800) {
        return -1;
      }
      uVar4 = uVar4 | (byte)src[2];
      iVar5 = 3;
    }
    else {
      if ((uVar3 & 0xfffffff8) != 0xf0) {
        return -1;
      }
      uVar4 = (uint)bVar2 << 0xc | (uVar3 & 7) << 0x12;
      if (0xfffff < uVar4 - 0x10000) {
        return -1;
      }
      uVar4 = (uint)(byte)src[3] | (uint)(byte)src[2] << 6 | uVar4;
      iVar5 = 4;
    }
    *size = iVar5;
  }
  return uVar4;
}

Assistant:

int utf8_decode(const char *src, int *size) 
{
	int c = src[0] & 255;
	int r;

	*size = 1;
	if ((c & 0x80) == 0)
	{
		return c;
	}

	int c1 = src[1] & 255;

	if ((c & 0xE0) == 0xC0) 
	{
		r = ((c & 0x1F) << 6) | c1;
		if (r >= 128) 
		{
			*size = 2;
			return r;
		}
		return -1;
	}

	int c2 = src[2] & 255;

	if ((c & 0xF0) == 0xE0) 
	{
		r = ((c & 0x0F) << 12) | (c1 << 6) | c2;
		if (r >= 2048 && (r < 55296 || r > 57343)) 
		{
			*size = 3;
			return r;
		}
		return -1;
	}
	
	int c3 = src[3] & 255;

	if ((c & 0xF8) == 0xF0) 
	{
		r = ((c & 0x07) << 18) | (c1 << 12) | (c2 << 6) | c3;
		if (r >= 65536 && r <= 1114111) 
		{
			*size = 4;
			return r;
		}
	}
	return -1;
}